

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# token.cpp
# Opt level: O0

vector<Token,_std::allocator<Token>_> *
Tokenize(vector<Token,_std::allocator<Token>_> *__return_storage_ptr__,istream *cl)

{
  bool bVar1;
  char cVar2;
  int iVar3;
  istream *piVar4;
  logic_error *plVar5;
  allocator<char> local_301;
  value_type local_300;
  allocator<char> local_2d1;
  value_type local_2d0;
  allocator<char> local_2a1;
  value_type local_2a0;
  allocator<char> local_271;
  value_type local_270;
  allocator<char> local_241;
  value_type local_240;
  allocator<char> local_211;
  value_type local_210;
  allocator<char> local_1e1;
  value_type local_1e0;
  allocator<char> local_1b1;
  value_type local_1b0;
  allocator<char> local_181;
  value_type local_180;
  allocator<char> local_151;
  value_type local_150;
  allocator<char> local_121;
  value_type local_120;
  allocator<char> local_f1;
  value_type local_f0;
  value_type local_c8;
  string local_a0 [8];
  string event;
  int local_58;
  allocator<char> local_51;
  int i;
  string date;
  char local_1a [2];
  char c;
  istream *piStack_18;
  istream *cl_local;
  vector<Token,_std::allocator<Token>_> *tokens;
  
  local_1a[1] = 0;
  piStack_18 = cl;
  cl_local = (istream *)__return_storage_ptr__;
  std::vector<Token,_std::allocator<Token>_>::vector(__return_storage_ptr__);
  while( true ) {
    while( true ) {
      while( true ) {
        while( true ) {
          while( true ) {
            piVar4 = std::operator>>(piStack_18,local_1a);
            bVar1 = std::ios::operator_cast_to_bool
                              ((ios *)(piVar4 + *(long *)(*(long *)piVar4 + -0x18)));
            if (!bVar1) {
              return __return_storage_ptr__;
            }
            iVar3 = isdigit((int)local_1a[0]);
            cVar2 = local_1a[0];
            if (iVar3 == 0) break;
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>((string *)&i,1,cVar2,&local_51);
            std::allocator<char>::~allocator(&local_51);
            for (local_58 = 0; local_58 < 3; local_58 = local_58 + 1) {
              while( true ) {
                iVar3 = std::istream::peek();
                iVar3 = isdigit(iVar3);
                if (iVar3 == 0) break;
                cVar2 = std::istream::get();
                std::__cxx11::string::operator+=((string *)&i,cVar2);
              }
              if (local_58 < 2) {
                cVar2 = std::istream::get();
                std::__cxx11::string::operator+=((string *)&i,cVar2);
              }
            }
            std::__cxx11::string::string((string *)(event.field_2._M_local_buf + 8),(string *)&i);
            std::vector<Token,_std::allocator<Token>_>::push_back
                      (__return_storage_ptr__,(value_type *)((long)&event.field_2 + 8));
            Token::~Token((Token *)((long)&event.field_2 + 8));
            std::__cxx11::string::~string((string *)&i);
          }
          if (local_1a[0] != '\"') break;
          std::__cxx11::string::string(local_a0);
          std::getline<char,std::char_traits<char>,std::allocator<char>>(piStack_18,local_a0,'\"');
          std::__cxx11::string::string((string *)&local_c8,local_a0);
          local_c8.type = EVENT;
          std::vector<Token,_std::allocator<Token>_>::push_back(__return_storage_ptr__,&local_c8);
          Token::~Token(&local_c8);
          std::__cxx11::string::~string(local_a0);
        }
        if (local_1a[0] != 'd') break;
        iVar3 = std::istream::get();
        if (((iVar3 != 0x61) || (iVar3 = std::istream::get(), iVar3 != 0x74)) ||
           (iVar3 = std::istream::get(), iVar3 != 0x65)) {
          plVar5 = (logic_error *)__cxa_allocate_exception(0x10);
          std::logic_error::logic_error(plVar5,"Unknown token");
          __cxa_throw(plVar5,&std::logic_error::typeinfo,std::logic_error::~logic_error);
        }
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_f0,"date",&local_f1);
        local_f0.type = COLUMN;
        std::vector<Token,_std::allocator<Token>_>::push_back(__return_storage_ptr__,&local_f0);
        Token::~Token(&local_f0);
        std::allocator<char>::~allocator(&local_f1);
      }
      if (local_1a[0] == 'e') break;
      if (local_1a[0] == 'A') {
        iVar3 = std::istream::get();
        if ((iVar3 != 0x4e) || (iVar3 = std::istream::get(), iVar3 != 0x44)) {
          plVar5 = (logic_error *)__cxa_allocate_exception(0x10);
          std::logic_error::logic_error(plVar5,"Unknown token");
          __cxa_throw(plVar5,&std::logic_error::typeinfo,std::logic_error::~logic_error);
        }
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_150,"AND",&local_151);
        local_150.type = LOGICAL_OP;
        std::vector<Token,_std::allocator<Token>_>::push_back(__return_storage_ptr__,&local_150);
        Token::~Token(&local_150);
        std::allocator<char>::~allocator(&local_151);
      }
      else if (local_1a[0] == 'O') {
        iVar3 = std::istream::get();
        if (iVar3 != 0x52) {
          plVar5 = (logic_error *)__cxa_allocate_exception(0x10);
          std::logic_error::logic_error(plVar5,"Unknown token");
          __cxa_throw(plVar5,&std::logic_error::typeinfo,std::logic_error::~logic_error);
        }
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_180,"OR",&local_181);
        local_180.type = LOGICAL_OP;
        std::vector<Token,_std::allocator<Token>_>::push_back(__return_storage_ptr__,&local_180);
        Token::~Token(&local_180);
        std::allocator<char>::~allocator(&local_181);
      }
      else if (local_1a[0] == '(') {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_1b0,"(",&local_1b1);
        local_1b0.type = PAREN_LEFT;
        std::vector<Token,_std::allocator<Token>_>::push_back(__return_storage_ptr__,&local_1b0);
        Token::~Token(&local_1b0);
        std::allocator<char>::~allocator(&local_1b1);
      }
      else if (local_1a[0] == ')') {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_1e0,")",&local_1e1);
        local_1e0.type = PAREN_RIGHT;
        std::vector<Token,_std::allocator<Token>_>::push_back(__return_storage_ptr__,&local_1e0);
        Token::~Token(&local_1e0);
        std::allocator<char>::~allocator(&local_1e1);
      }
      else if (local_1a[0] == '<') {
        iVar3 = std::istream::peek();
        if (iVar3 == 0x3d) {
          std::istream::get();
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>((string *)&local_210,"<=",&local_211);
          local_210.type = COMPARE_OP;
          std::vector<Token,_std::allocator<Token>_>::push_back(__return_storage_ptr__,&local_210);
          Token::~Token(&local_210);
          std::allocator<char>::~allocator(&local_211);
        }
        else {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>((string *)&local_240,"<",&local_241);
          local_240.type = COMPARE_OP;
          std::vector<Token,_std::allocator<Token>_>::push_back(__return_storage_ptr__,&local_240);
          Token::~Token(&local_240);
          std::allocator<char>::~allocator(&local_241);
        }
      }
      else if (local_1a[0] == '>') {
        iVar3 = std::istream::peek();
        if (iVar3 == 0x3d) {
          std::istream::get();
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>((string *)&local_270,">=",&local_271);
          local_270.type = COMPARE_OP;
          std::vector<Token,_std::allocator<Token>_>::push_back(__return_storage_ptr__,&local_270);
          Token::~Token(&local_270);
          std::allocator<char>::~allocator(&local_271);
        }
        else {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>((string *)&local_2a0,">",&local_2a1);
          local_2a0.type = COMPARE_OP;
          std::vector<Token,_std::allocator<Token>_>::push_back(__return_storage_ptr__,&local_2a0);
          Token::~Token(&local_2a0);
          std::allocator<char>::~allocator(&local_2a1);
        }
      }
      else if (local_1a[0] == '=') {
        iVar3 = std::istream::get();
        if (iVar3 != 0x3d) {
          plVar5 = (logic_error *)__cxa_allocate_exception(0x10);
          std::logic_error::logic_error(plVar5,"Unknown token");
          __cxa_throw(plVar5,&std::logic_error::typeinfo,std::logic_error::~logic_error);
        }
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_2d0,"==",&local_2d1);
        local_2d0.type = COMPARE_OP;
        std::vector<Token,_std::allocator<Token>_>::push_back(__return_storage_ptr__,&local_2d0);
        Token::~Token(&local_2d0);
        std::allocator<char>::~allocator(&local_2d1);
      }
      else if (local_1a[0] == '!') {
        iVar3 = std::istream::get();
        if (iVar3 != 0x3d) {
          plVar5 = (logic_error *)__cxa_allocate_exception(0x10);
          std::logic_error::logic_error(plVar5,"Unknown token");
          __cxa_throw(plVar5,&std::logic_error::typeinfo,std::logic_error::~logic_error);
        }
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_300,"!=",&local_301);
        local_300.type = COMPARE_OP;
        std::vector<Token,_std::allocator<Token>_>::push_back(__return_storage_ptr__,&local_300);
        Token::~Token(&local_300);
        std::allocator<char>::~allocator(&local_301);
      }
    }
    iVar3 = std::istream::get();
    if ((((iVar3 != 0x76) || (iVar3 = std::istream::get(), iVar3 != 0x65)) ||
        (iVar3 = std::istream::get(), iVar3 != 0x6e)) ||
       (iVar3 = std::istream::get(), iVar3 != 0x74)) break;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_120,"event",&local_121);
    local_120.type = COLUMN;
    std::vector<Token,_std::allocator<Token>_>::push_back(__return_storage_ptr__,&local_120);
    Token::~Token(&local_120);
    std::allocator<char>::~allocator(&local_121);
  }
  plVar5 = (logic_error *)__cxa_allocate_exception(0x10);
  std::logic_error::logic_error(plVar5,"Unknown token");
  __cxa_throw(plVar5,&std::logic_error::typeinfo,std::logic_error::~logic_error);
}

Assistant:

vector<Token> Tokenize(istream& cl) {
  vector<Token> tokens;

  char c;
  while (cl >> c) {
    if (isdigit(c)) {
      string date(1, c);
      for (int i = 0; i < 3; ++i) {
        while (isdigit(cl.peek())) {
          date += cl.get();
        }
        if (i < 2) {
          date += cl.get(); // Consume '-'
        }
      }
      tokens.push_back({date, TokenType::DATE});
    } else if (c == '"') {
      string event;
      getline(cl, event, '"');
      tokens.push_back({event, TokenType::EVENT});
    } else if (c == 'd') {
      if (cl.get() == 'a' && cl.get() == 't' && cl.get() == 'e') {
        tokens.push_back({"date", TokenType::COLUMN});
      } else {
        throw logic_error("Unknown token");
      }
    } else if (c == 'e') {
      if (cl.get() == 'v' && cl.get() == 'e' && cl.get() == 'n' &&
          cl.get() == 't') {
        tokens.push_back({"event", TokenType::COLUMN});
      } else {
        throw logic_error("Unknown token");
      }
    } else if (c == 'A') {
      if (cl.get() == 'N' && cl.get() == 'D') {
        tokens.push_back({"AND", TokenType::LOGICAL_OP});
      } else {
        throw logic_error("Unknown token");
      }
    } else if (c == 'O') {
      if (cl.get() == 'R') {
        tokens.push_back({"OR", TokenType::LOGICAL_OP});
      } else {
        throw logic_error("Unknown token");
      }
    } else if (c == '(') {
      tokens.push_back({"(", TokenType::PAREN_LEFT});
    } else if (c == ')') {
      tokens.push_back({")", TokenType::PAREN_RIGHT});
    } else if (c == '<') {
      if (cl.peek() == '=') {
        cl.get();
        tokens.push_back({"<=", TokenType::COMPARE_OP});
      } else {
        tokens.push_back({"<", TokenType::COMPARE_OP});
      }
    } else if (c == '>') {
      if (cl.peek() == '=') {
        cl.get();
        tokens.push_back({">=", TokenType::COMPARE_OP});
      } else {
        tokens.push_back({">", TokenType::COMPARE_OP});
      }
    } else if (c == '=') {
      if (cl.get() == '=') {
        tokens.push_back({"==", TokenType::COMPARE_OP});
      } else {
        throw logic_error("Unknown token");
      }
    } else if (c == '!') {
      if (cl.get() == '=') {
        tokens.push_back({"!=", TokenType::COMPARE_OP});
      } else {
        throw logic_error("Unknown token");
      }
    }
  }

  return tokens;
}